

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O3

void WebPMultRow_C(uint8_t *ptr,uint8_t *alpha,int width,int inverse)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < width) {
    uVar3 = 0;
    do {
      bVar1 = alpha[uVar3];
      if (bVar1 != 0xff) {
        if (bVar1 == 0) {
          ptr[uVar3] = '\0';
        }
        else {
          if (inverse == 0) {
            iVar2 = (uint)bVar1 * 0x10101;
          }
          else {
            iVar2 = (int)(0xff000000 / (ulong)(uint)bVar1);
          }
          ptr[uVar3] = (uint8_t)((uint)ptr[uVar3] * iVar2 + 0x800000 >> 0x18);
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)width != uVar3);
  }
  return;
}

Assistant:

void WebPMultRow_C(uint8_t* WEBP_RESTRICT const ptr,
                   const uint8_t* WEBP_RESTRICT const alpha,
                   int width, int inverse) {
  int x;
  for (x = 0; x < width; ++x) {
    const uint32_t a = alpha[x];
    if (a != 255) {
      if (a == 0) {
        ptr[x] = 0;
      } else {
        const uint32_t scale = GetScale(a, inverse);
        ptr[x] = Mult(ptr[x], scale);
      }
    }
  }
}